

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

shared_ptr<fasttext::Matrix> __thiscall
fasttext::FastText::getInputMatrixFromFile(FastText *this,string *filename)

{
  byte bVar1;
  int32_t iVar2;
  invalid_argument *piVar3;
  DenseMatrix *this_00;
  element_type *peVar4;
  real *prVar5;
  element_type *peVar6;
  string *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Dictionary *in_RSI;
  EVP_PKEY_CTX *ctx;
  element_type *in_RDI;
  shared_ptr<fasttext::Matrix> sVar7;
  size_t j_1;
  int32_t idx;
  size_t i_1;
  shared_ptr<fasttext::DenseMatrix> input;
  size_t j;
  string word;
  size_t i;
  int64_t dim;
  int64_t n;
  shared_ptr<fasttext::DenseMatrix> mat;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  ifstream in;
  undefined4 in_stack_fffffffffffffb98;
  real in_stack_fffffffffffffb9c;
  DenseMatrix *in_stack_fffffffffffffba0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffba8;
  int in_stack_fffffffffffffbb0;
  int32_t in_stack_fffffffffffffbb4;
  undefined4 in_stack_fffffffffffffbc0;
  undefined4 in_stack_fffffffffffffbc4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbc8;
  undefined4 in_stack_fffffffffffffbd0;
  undefined4 in_stack_fffffffffffffbd4;
  undefined4 in_stack_fffffffffffffbd8;
  undefined4 in_stack_fffffffffffffbdc;
  long in_stack_fffffffffffffbe8;
  int __val;
  string *this_01;
  undefined8 in_stack_fffffffffffffbf0;
  ulong local_3c8;
  undefined4 in_stack_fffffffffffffc40;
  undefined4 in_stack_fffffffffffffc44;
  int64_t in_stack_fffffffffffffc48;
  ulong uVar8;
  undefined4 in_stack_fffffffffffffc50;
  undefined4 in_stack_fffffffffffffc54;
  ulong local_398;
  string local_390 [32];
  ulong local_370;
  undefined1 local_351;
  string local_2b0 [39];
  undefined1 local_289;
  string local_288 [48];
  ulong local_258;
  ulong local_250 [3];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_238;
  istream local_220 [544];
  
  std::ifstream::ifstream(local_220,in_RDX,_S_in);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x19515e);
  std::shared_ptr<fasttext::DenseMatrix>::shared_ptr((shared_ptr<fasttext::DenseMatrix> *)0x19516b);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    local_289 = 1;
    piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+(in_stack_fffffffffffffbc8,
                   (char *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
    std::invalid_argument::invalid_argument(piVar3,local_288);
    local_289 = 0;
    __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  this_00 = (DenseMatrix *)std::istream::operator>>(local_220,(long *)local_250);
  std::istream::operator>>(this_00,(long *)&local_258);
  uVar8 = local_258;
  peVar4 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1952b5);
  if (uVar8 == (long)peVar4->dim) {
    std::make_shared<fasttext::DenseMatrix,long&,long&>
              ((long *)in_stack_fffffffffffffbc8,
               (long *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
    std::shared_ptr<fasttext::DenseMatrix>::operator=
              ((shared_ptr<fasttext::DenseMatrix> *)in_stack_fffffffffffffba0,
               (shared_ptr<fasttext::DenseMatrix> *)
               CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
    std::shared_ptr<fasttext::DenseMatrix>::~shared_ptr
              ((shared_ptr<fasttext::DenseMatrix> *)0x19551a);
    for (local_370 = 0; iVar2 = (int32_t)((ulong)in_stack_fffffffffffffbf0 >> 0x20),
        local_370 < local_250[0]; local_370 = local_370 + 1) {
      this_01 = local_390;
      std::__cxx11::string::string(this_01);
      std::operator>>(local_220,this_01);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                  in_stack_fffffffffffffba8);
      std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x19558a);
      Dictionary::add(in_RSI,(string *)in_RDI);
      for (local_398 = 0; local_398 < local_258; local_398 = local_398 + 1) {
        std::__shared_ptr_access<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1955c7);
        prVar5 = DenseMatrix::at(in_stack_fffffffffffffba0,
                                 CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                                 0x1955df);
        std::istream::operator>>(local_220,prVar5);
      }
      std::__cxx11::string::~string(local_390);
    }
    std::ifstream::close();
    std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x19567e);
    ctx = (EVP_PKEY_CTX *)0x1;
    Dictionary::threshold
              ((Dictionary *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
               in_stack_fffffffffffffc48,
               CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40));
    peVar6 = std::
             __shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1956a2);
    Dictionary::init(peVar6,ctx);
    peVar6 = std::
             __shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1956bd);
    Dictionary::nwords(peVar6);
    std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1956d8);
    std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1956fb);
    std::make_shared<fasttext::DenseMatrix,int,int&>
              ((int *)in_stack_fffffffffffffbc8,
               (int *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
    std::__shared_ptr_access<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x195729);
    std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x19573b);
    std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x195766);
    std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x19577d);
    DenseMatrix::uniform(this_00,(real)(uVar8 >> 0x20),(uint)uVar8,iVar2);
    for (uVar8 = 0; uVar8 < local_250[0]; uVar8 = uVar8 + 1) {
      std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1957cc);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_238,uVar8);
      iVar2 = Dictionary::getId((Dictionary *)
                                CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                                in_stack_fffffffffffffba8);
      if (-1 < iVar2) {
        peVar6 = std::
                 __shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x19582a);
        in_stack_fffffffffffffbb4 = Dictionary::nwords(peVar6);
        in_stack_fffffffffffffbb0 = iVar2;
        if (iVar2 < in_stack_fffffffffffffbb4) {
          for (local_3c8 = 0; in_stack_fffffffffffffbb0 = iVar2, local_3c8 < local_258;
              local_3c8 = local_3c8 + 1) {
            std::
            __shared_ptr_access<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x19589e);
            in_stack_fffffffffffffba8 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 DenseMatrix::at(in_stack_fffffffffffffba0,
                                 CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                                 0x1958b6);
            in_stack_fffffffffffffb9c = *(real *)in_stack_fffffffffffffba8;
            std::
            __shared_ptr_access<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1958d9);
            in_stack_fffffffffffffba0 =
                 (DenseMatrix *)
                 DenseMatrix::at(in_stack_fffffffffffffba0,
                                 CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                                 0x1958f1);
            *(real *)&(in_stack_fffffffffffffba0->super_Matrix)._vptr_Matrix =
                 in_stack_fffffffffffffb9c;
          }
        }
      }
    }
    std::shared_ptr<fasttext::Matrix>::shared_ptr<fasttext::DenseMatrix,void>
              ((shared_ptr<fasttext::Matrix> *)in_stack_fffffffffffffba0,
               (shared_ptr<fasttext::DenseMatrix> *)
               CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
    std::shared_ptr<fasttext::DenseMatrix>::~shared_ptr
              ((shared_ptr<fasttext::DenseMatrix> *)0x19595a);
    std::shared_ptr<fasttext::DenseMatrix>::~shared_ptr
              ((shared_ptr<fasttext::DenseMatrix> *)0x195967);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
    std::ifstream::~ifstream(local_220);
    sVar7.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar7.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
    return (shared_ptr<fasttext::Matrix>)
           sVar7.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>;
  }
  local_351 = 1;
  piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(in_stack_fffffffffffffbe8);
  __val = (int)((ulong)in_stack_fffffffffffffbe8 >> 0x20);
  std::operator+((char *)in_stack_fffffffffffffba8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffba0);
  std::operator+(in_stack_fffffffffffffba8,(char *)in_stack_fffffffffffffba0);
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x195344);
  std::__cxx11::to_string(__val);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0));
  std::operator+(in_stack_fffffffffffffba8,(char *)in_stack_fffffffffffffba0);
  std::invalid_argument::invalid_argument(piVar3,local_2b0);
  local_351 = 0;
  __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

std::shared_ptr<Matrix> FastText::getInputMatrixFromFile(
    const std::string& filename) const {
  std::ifstream in(filename);
  std::vector<std::string> words;
  std::shared_ptr<DenseMatrix> mat; // temp. matrix for pretrained vectors
  int64_t n, dim;
  if (!in.is_open()) {
    throw std::invalid_argument(filename + " cannot be opened for loading!");
  }
  in >> n >> dim;
  if (dim != args_->dim) {
    throw std::invalid_argument(
        "Dimension of pretrained vectors (" + std::to_string(dim) +
        ") does not match dimension (" + std::to_string(args_->dim) + ")!");
  }
  mat = std::make_shared<DenseMatrix>(n, dim);
  for (size_t i = 0; i < n; i++) {
    std::string word;
    in >> word;
    words.push_back(word);
    dict_->add(word);
    for (size_t j = 0; j < dim; j++) {
      in >> mat->at(i, j);
    }
  }
  in.close();

  dict_->threshold(1, 0);
  dict_->init();
  std::shared_ptr<DenseMatrix> input = std::make_shared<DenseMatrix>(
      dict_->nwords() + args_->bucket, args_->dim);
  input->uniform(1.0 / args_->dim, args_->thread, args_->seed);

  for (size_t i = 0; i < n; i++) {
    int32_t idx = dict_->getId(words[i]);
    if (idx < 0 || idx >= dict_->nwords()) {
      continue;
    }
    for (size_t j = 0; j < dim; j++) {
      input->at(idx, j) = mat->at(i, j);
    }
  }
  return input;
}